

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# large.c
# Opt level: O2

void * duckdb_je_large_palloc(tsdn_t *tsdn,arena_t *arena,size_t usize,size_t alignment,_Bool zero)

{
  tcache_slow_t *tcache_slow;
  tcache_t *tcache;
  arena_t *paVar1;
  long lVar2;
  _Bool _Var3;
  ulong uVar4;
  edata_t *peVar5;
  edata_t *peVar6;
  undefined1 delay_trigger;
  edata_t *peVar7;
  size_t sVar8;
  ulong uVar9;
  
  if (alignment < 0x1001 && usize < 0x3801) {
    uVar4 = -alignment & (usize + alignment) - 1;
    if (uVar4 < 0x1001) {
      sVar8 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar4 + 7 >> 3]];
    }
    else {
      if (0x7000000000000000 < uVar4) {
        return (void *)0x0;
      }
      uVar9 = uVar4 * 2 - 1;
      lVar2 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar9 = -1L << (0x3c - ((byte)lVar2 ^ 0x3f) & 0x3f);
      sVar8 = ~uVar9 + uVar4 & uVar9;
    }
    uVar4 = 0x4000;
    if (0x3fff < sVar8) goto LAB_00e722e3;
  }
  else {
    if (0x7000000000000000 < alignment) {
      return (void *)0x0;
    }
    uVar4 = 0x4000;
    if (0x4000 < usize) {
      if (usize < 0x7000000000000001) {
        uVar4 = usize * 2 - 1;
        lVar2 = 0x3f;
        if (uVar4 != 0) {
          for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        uVar4 = -1L << (0x3c - ((byte)lVar2 ^ 0x3f) & 0x3f);
        uVar4 = ~uVar4 + usize & uVar4;
      }
      else {
        uVar4 = 0;
      }
      if (uVar4 < usize) {
        return (void *)0x0;
      }
    }
LAB_00e722e3:
    sVar8 = 0;
    if (uVar4 <= (duckdb_je_sz_large_pad + (alignment + 0xfff & 0x7ffffffffffff000) + uVar4) -
                 0x1000) {
      sVar8 = uVar4;
    }
  }
  if (sVar8 + 0x8fffffffffffffff < 0x9000000000000000) {
    return (void *)0x0;
  }
  if (tsdn != (tsdn_t *)0x0) {
    if (arena != (arena_t *)0x0) goto LAB_00e723ae;
    arena = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena;
    if (arena == (arena_t *)0x0) {
      if ((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level <
          '\x01') {
        arena = duckdb_je_arena_choose_hard(&tsdn->tsd,false);
        if ((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == true
           ) {
          tcache_slow = &(tsdn->tsd).
                         cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow;
          tcache = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
          paVar1 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow.
                   arena;
          if (paVar1 == (arena_t *)0x0) {
            duckdb_je_tcache_arena_associate(tsdn,tcache_slow,tcache,arena);
          }
          else if (paVar1 != arena) {
            duckdb_je_tcache_arena_reassociate(tsdn,tcache_slow,tcache,arena);
          }
        }
      }
      else {
        arena = (arena_t *)duckdb_je_arenas[0].repr;
        if (duckdb_je_arenas[0].repr == (void *)0x0) {
          arena = duckdb_je_arena_init(tsdn,0,&duckdb_je_arena_config_default);
        }
      }
    }
    if ((usize < (arena->pa_shard).pac.duckdb_je_oversize_threshold.repr) ||
       (duckdb_je_manual_arena_base <= arena->ind)) goto LAB_00e723ae;
    arena = duckdb_je_arena_choose_huge(&tsdn->tsd);
  }
  if (arena == (arena_t *)0x0) {
    return (void *)0x0;
  }
LAB_00e723ae:
  peVar5 = duckdb_je_arena_extent_alloc_large(tsdn,arena,usize,alignment,zero);
  if (peVar5 == (edata_t *)0x0) {
    return (void *)0x0;
  }
  delay_trigger = 0x5c;
  if (duckdb_je_manual_arena_base <= arena->ind) {
    malloc_mutex_lock(tsdn,&arena->large_mtx);
    (peVar5->field_5).ql_link_active.qre_next = peVar5;
    (peVar5->field_5).ql_link_active.qre_prev = peVar5;
    peVar7 = (arena->large).head.qlh_first;
    peVar6 = peVar5;
    if (peVar7 != (edata_t *)0x0) {
      (peVar5->field_5).ql_link_active.qre_next = (peVar7->field_5).ql_link_active.qre_prev;
      (((arena->large).head.qlh_first)->field_5).ql_link_active.qre_prev = peVar5;
      (peVar5->field_5).ql_link_active.qre_prev =
           (((peVar5->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next;
      peVar6 = (arena->large).head.qlh_first;
      peVar7 = (peVar6->field_5).ql_link_active.qre_prev;
      (peVar7->field_5).ql_link_active.qre_next = peVar6;
      (((peVar5->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = peVar5;
      peVar6 = (peVar5->field_5).ql_link_active.qre_next;
    }
    delay_trigger = SUB81(peVar7,0);
    (arena->large).head.qlh_first = peVar6;
    (arena->large_mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&(arena->large_mtx).field_0 + 0x48));
  }
  if ((tsdn != (tsdn_t *)0x0) &&
     (_Var3 = ticker_geom_ticks(&(tsdn->tsd).
                                 cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker
                                ,&(tsdn->tsd).
                                  cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state,
                                (uint)('\0' < (tsdn->tsd).
                                              cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level
                                      ),(_Bool)delay_trigger), _Var3)) {
    duckdb_je_arena_decay(tsdn,arena,false,false);
  }
  return peVar5->e_addr;
}

Assistant:

void *
large_palloc(tsdn_t *tsdn, arena_t *arena, size_t usize, size_t alignment,
    bool zero) {
	size_t ausize;
	edata_t *edata;
	UNUSED bool idump JEMALLOC_CC_SILENCE_INIT(false);

	assert(!tsdn_null(tsdn) || arena != NULL);

	ausize = sz_sa2u(usize, alignment);
	if (unlikely(ausize == 0 || ausize > SC_LARGE_MAXCLASS)) {
		return NULL;
	}

	if (likely(!tsdn_null(tsdn))) {
		arena = arena_choose_maybe_huge(tsdn_tsd(tsdn), arena, usize);
	}
	if (unlikely(arena == NULL) || (edata = arena_extent_alloc_large(tsdn,
	    arena, usize, alignment, zero)) == NULL) {
		return NULL;
	}

	/* See comments in arena_bin_slabs_full_insert(). */
	if (!arena_is_auto(arena)) {
		/* Insert edata into large. */
		malloc_mutex_lock(tsdn, &arena->large_mtx);
		edata_list_active_append(&arena->large, edata);
		malloc_mutex_unlock(tsdn, &arena->large_mtx);
	}

	arena_decay_tick(tsdn, arena);
	return edata_addr_get(edata);
}